

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>(WasmBytecodeGenerator *this)

{
  IWasmByteCodeWriter *pIVar1;
  code *pcVar2;
  EmitInfoBase EVar3;
  uint uVar4;
  bool bVar5;
  ArgSlot lhs;
  Local expectedType;
  RegSlot RVar6;
  uint uVar7;
  uint32 uVar8;
  uint32 uVar9;
  AsmJsRetType AVar10;
  WasmReaderBase *pWVar11;
  undefined4 *puVar12;
  WasmCompilationException *pWVar13;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  EmitInfo EVar14;
  WasmRegisterSpace *pWVar15;
  undefined2 uVar16;
  bool bVar17;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar19;
  undefined1 auVar18 [16];
  PolymorphicEmitInfo PVar20;
  WasmType local_190;
  uint32 maxDepthForLevel;
  EmitInfo local_124;
  EmitInfo singleResultInfo;
  Local local_114;
  EmitInfo local_110;
  EmitInfo info_2;
  uint32 i_5;
  uint32 i_4;
  RegSlot local_f8;
  ushort local_f2;
  RegSlot location;
  AsmJsRetType AStack_ec;
  OpCodeAsmJs convertOp;
  uint32 i_3;
  RegSlot local_e4;
  WasmType singleResType;
  RegSlot varRetReg;
  ArgSlot args;
  EmitInfo EStack_d8;
  uint local_d0;
  RegSlot local_cc;
  uint32 i_2;
  RegSlot slotReg;
  RegSlot funcReg;
  ArgSlot currentArgSize;
  OpCodeAsmJs argOp;
  EmitInfo info_1;
  uint local_b0;
  ArgSlot i_1;
  uint32 argLoc;
  EmitInfo info;
  int i;
  TrackAllocData local_90;
  EmitInfo *local_68;
  EmitInfo *argsList;
  ArgSlot nArgs;
  ushort local_4e;
  uint16 local_4c;
  anon_class_1_0_00000001 local_49;
  OpCodeAsmJs startCallOp;
  ArgSlot argSize;
  EmitInfo EStack_48;
  anon_class_1_0_00000001 argOverflow;
  EmitInfo EStack_3c;
  bool isImportCall;
  EmitInfo indirectIndexInfo;
  ProfileId profileId;
  WasmSignature *calleeSignature;
  uint32 signatureId;
  uint32 funcNum;
  WasmBytecodeGenerator *this_local;
  PolymorphicEmitInfo retInfo;
  
  stack0xffffffffffffffd0 = (WasmSignature *)0x0;
  indirectIndexInfo.super_EmitInfoBase.location._2_2_ = 0xffff;
  EmitInfo::EmitInfo(&stack0xffffffffffffffc4);
  pWVar11 = GetReader(this);
  bVar17 = (pWVar11->m_currentNode).field_1.call.funcType == Import;
  if (((!bVar17) &&
      (pWVar11 = GetReader(this), (pWVar11->m_currentNode).field_1.call.funcType != Function)) &&
     (pWVar11 = GetReader(this), (pWVar11->m_currentNode).field_1.call.funcType != ImportThunk)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x449,
                       "(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk)"
                       ,
                       "isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk"
                      );
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  EStack_48 = PopEvalStack(this,FirstLocalType,L"Indirect call index must be int type");
  EStack_3c = EStack_48;
  pWVar11 = GetReader(this);
  register0x00000000 =
       Js::WebAssemblyModule::GetSignature
                 (this->m_module,(pWVar11->m_currentNode).field_1.brTable.numTargets);
  if (bVar17) {
    lhs = WasmSignature::GetParamCount(register0x00000000);
    local_4c = UInt16Math::
               Mul<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
                         (lhs,8,&local_49);
    local_4e = 0x11;
  }
  else {
    local_4e = 0x1c;
    local_4c = WasmSignature::GetParamsSize(register0x00000000);
  }
  local_4c = UInt16Math::
             Add<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
                       (local_4c,8,&local_49);
  bVar5 = Math::IsAligned<unsigned_short>(local_4c,8);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                        ,0x478,"((0))","Wasm argument size should always be Var aligned");
    if (!bVar17) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
    pWVar13 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(pWVar13,L"Internal Error");
    __cxa_throw(pWVar13,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1f])(this->m_writer,(ulong)local_4e,(ulong)local_4c)
  ;
  argsList._2_2_ = WasmSignature::GetParamCount(stack0xffffffffffffffd0);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,(type_info *)&EmitInfo::typeinfo,0,(ulong)(ushort)argsList._2_2_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
             ,0x481);
  this_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo(&(this->m_alloc).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,&local_90);
  local_68 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::EmitInfo,false>
                       ((Memory *)this_00,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)(ushort)argsList._2_2_);
  info.super_EmitInfoBase.location = (RegSlot)(ushort)argsList._2_2_;
  while (info.super_EmitInfoBase.location = info.super_EmitInfoBase.location - 1,
        -1 < (int)info.super_EmitInfoBase.location) {
    expectedType = WasmSignature::GetParam
                             (stack0xffffffffffffffd0,(ArgSlot)info.super_EmitInfoBase.location);
    EVar14 = PopEvalStack(this,expectedType,L"Call argument does not match formal type");
    local_68[(int)info.super_EmitInfoBase.location] = EVar14;
  }
  local_b0 = 1;
  info_1.type._2_2_ = Void >> 0x10;
  do {
    if ((ushort)argsList._2_2_ <= (ushort)info_1.type._2_2_) {
      pWVar15 = GetRegisterSpace(this,Ptr);
      i_2 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar15);
      pWVar15 = GetRegisterSpace(this,Ptr);
      RVar6 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar15);
      pIVar1 = this->m_writer;
      local_cc = RVar6;
      uVar7 = Js::WebAssemblyModule::GetTableEnvironmentOffset(this->m_module);
      (*pIVar1->_vptr_IWasmByteCodeWriter[0x18])(pIVar1,0x4d,(ulong)RVar6,1,(ulong)uVar7);
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
                (this->m_writer,0x58,(ulong)i_2,(ulong)local_cc,(ulong)EStack_3c & 0xffffffff);
      pWVar15 = GetRegisterSpace(this,Ptr);
      WAsmJs::RegisterSpace::ReleaseTmpRegister(pWVar15,local_cc);
      uVar9 = i_2;
      pIVar1 = this->m_writer;
      uVar8 = WasmSignature::GetSignatureId(stack0xffffffffffffffd0);
      (*pIVar1->_vptr_IWasmByteCodeWriter[9])(pIVar1,0x59,(ulong)uVar9,(ulong)uVar8);
      PolymorphicEmitInfo::PolymorphicEmitInfo((PolymorphicEmitInfo *)&this_local);
      uVar9 = WasmSignature::GetResultCount(stack0xffffffffffffffd0);
      PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)&this_local,uVar9,&this->m_alloc);
      for (local_d0 = 0; uVar4 = local_d0,
          uVar9 = WasmSignature::GetResultCount(stack0xffffffffffffffd0), uVar4 < uVar9;
          local_d0 = local_d0 + 1) {
        varRetReg = WasmSignature::GetResult(stack0xffffffffffffffd0,local_d0);
        EmitInfo::EmitInfo(&stack0xffffffffffffff28,&varRetReg);
        PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)&this_local,EStack_d8,local_d0);
      }
      if (bVar17) {
        singleResType._2_2_ = WasmSignature::GetParamCount(stack0xffffffffffffffd0);
        UInt16Math::
        Inc<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
                  ((uint16 *)((long)&singleResType + 2),&local_49);
        pWVar15 = GetRegisterSpace(this,Ptr);
        local_e4 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar15);
        uVar9 = WasmSignature::GetResultCount(stack0xffffffffffffffd0);
        if (1 < uVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar17 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                              ,0x4e8,"(calleeSignature->GetResultCount() <= 1)",
                              "Multiple results from function imports not supported");
          if (!bVar17) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        uVar9 = WasmSignature::GetResultCount(stack0xffffffffffffffd0);
        if (uVar9 == 0) {
          local_190 = Void;
        }
        else {
          local_190 = WasmSignature::GetResult(stack0xffffffffffffffd0,0);
        }
        uVar9 = i_2;
        uVar16 = singleResType._2_2_;
        RVar6 = local_e4;
        i_3 = local_190;
        pIVar1 = this->m_writer;
        AStack_ec = WasmToAsmJs::GetAsmJsReturnType(local_190);
        (*pIVar1->_vptr_IWasmByteCodeWriter[0x20])
                  (pIVar1,0x12,(ulong)RVar6,(ulong)uVar9,(ulong)(ushort)uVar16,
                   (ulong)AStack_ec.which_,(uint)indirectIndexInfo.super_EmitInfoBase.location._2_2_
                  );
        pWVar15 = GetRegisterSpace(this,Ptr);
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pWVar15,local_e4);
        pWVar15 = GetRegisterSpace(this,Ptr);
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pWVar15,i_2);
        ReleaseLocation(this,&stack0xffffffffffffffc4);
        for (location = (RegSlot)(ushort)argsList._2_2_; location != 0; location = location - 1) {
          ReleaseLocation(this,local_68 + (location - 1));
        }
        uVar9 = WasmSignature::GetResultCount(stack0xffffffffffffffd0);
        if (uVar9 != 0) {
          local_f2 = 6;
          switch(i_3) {
          case 1:
            local_f2 = 0x18;
            break;
          case 2:
            local_f2 = 0x1b;
            break;
          case 3:
            local_f2 = 0x19;
            break;
          case 4:
            local_f2 = 0x1a;
            break;
          case 5:
            pWVar13 = (WasmCompilationException *)__cxa_allocate_exception(8);
            WasmCompilationException::WasmCompilationException
                      (pWVar13,L"Return type: v128 not supported in import calls");
            __cxa_throw(pWVar13,&WasmCompilationException::typeinfo,
                        WasmCompilationException::~WasmCompilationException);
          default:
            WasmTypes::
            CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                      ();
            pWVar13 = (WasmCompilationException *)__cxa_allocate_exception(8);
            WasmCompilationException::WasmCompilationException
                      (pWVar13,L"Unknown call return type %u",(ulong)i_3);
            __cxa_throw(pWVar13,&WasmCompilationException::typeinfo,
                        WasmCompilationException::~WasmCompilationException);
          }
          pWVar15 = GetRegisterSpace(this,i_3);
          local_f8 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar15);
          EmitInfo::EmitInfo((EmitInfo *)&i_5,local_f8,&i_3);
          PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)&this_local,_i_5,0);
          (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
                    (this->m_writer,(ulong)local_f2,(ulong)local_f8,(ulong)local_e4);
        }
      }
      else {
        pWVar15 = GetRegisterSpace(this,Ptr);
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pWVar15,i_2);
        ReleaseLocation(this,&stack0xffffffffffffffc4);
        for (info_2.type = (WasmType)(ushort)argsList._2_2_; info_2.type != Void;
            info_2.type = info_2.type - FirstLocalType) {
          ReleaseLocation(this,local_68 + (info_2.type - FirstLocalType));
        }
        for (info_2.super_EmitInfoBase.location = 0;
            EVar3.location = info_2.super_EmitInfoBase.location,
            uVar9 = WasmSignature::GetResultCount(stack0xffffffffffffffd0), EVar3.location < uVar9;
            info_2.super_EmitInfoBase.location = info_2.super_EmitInfoBase.location + 1) {
          local_114 = WasmSignature::GetResult
                                (stack0xffffffffffffffd0,info_2.super_EmitInfoBase.location);
          EmitInfo::EmitInfo(&local_110,&local_114);
          pWVar15 = GetRegisterSpace(this,local_110.type);
          local_110.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar15)
          ;
          singleResultInfo.type = local_110.type;
          singleResultInfo.super_EmitInfoBase.location = local_110.super_EmitInfoBase.location;
          PolymorphicEmitInfo::SetInfo
                    ((PolymorphicEmitInfo *)&this_local,singleResultInfo,
                     info_2.super_EmitInfoBase.location);
        }
        uVar9 = PolymorphicEmitInfo::Count((PolymorphicEmitInfo *)&this_local);
        if (uVar9 == 0) {
          maxDepthForLevel = 0;
          EmitInfo::EmitInfo(&local_124,&maxDepthForLevel);
          uVar19 = extraout_XMM0_Qb_00;
        }
        else {
          local_124 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)&this_local,0);
          uVar19 = extraout_XMM0_Qb;
        }
        uVar9 = i_2;
        EVar14 = local_124;
        auVar18._0_8_ = (double)(local_4c >> 3);
        auVar18._8_8_ = uVar19;
        auVar18 = roundsd(auVar18,auVar18,10);
        uVar16 = (undefined2)(int)auVar18._0_8_;
        pIVar1 = this->m_writer;
        singleResType._2_2_ = uVar16;
        AVar10 = WasmToAsmJs::GetAsmJsReturnType(local_124.type);
        (*pIVar1->_vptr_IWasmByteCodeWriter[0x20])
                  (pIVar1,0x1d,(ulong)EVar14 & 0xffffffff,(ulong)uVar9,(ulong)(ushort)uVar16,
                   (ulong)AVar10.which_,(uint)indirectIndexInfo.super_EmitInfoBase.location._2_2_);
      }
      Memory::DeleteArray<Memory::ArenaAllocator,Wasm::EmitInfo>
                (&this->m_alloc,(ulong)(ushort)argsList._2_2_,local_68);
      if (this->m_maxArgOutDepth < (ushort)singleResType._2_2_ + 1) {
        this->m_maxArgOutDepth = (ushort)singleResType._2_2_ + 1;
      }
      PVar20._4_4_ = 0;
      PVar20.count = (uint)this_local;
      PVar20.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)retInfo._0_8_;
      return PVar20;
    }
    _funcReg = local_68[(ushort)info_1.type._2_2_];
    slotReg._2_2_ = 6;
    switch(_currentArgSize) {
    case FirstLocalType:
      slotReg._2_2_ = 0x20;
      if (bVar17) {
        slotReg._2_2_ = 0x14;
      }
      break;
    case I64:
      slotReg._2_2_ = 0x21;
      if (bVar17) {
        slotReg._2_2_ = 0x15;
      }
      break;
    case F32:
      slotReg._2_2_ = 0x22;
      if (bVar17) {
        slotReg._2_2_ = 0x16;
      }
      break;
    case F64:
      slotReg._2_2_ = 0x1f;
      if (bVar17) {
        slotReg._2_2_ = 0x17;
      }
      break;
    case V128:
      Simd::EnsureSimdIsEnabled();
      slotReg._2_2_ = 0x145;
      if (bVar17) {
        slotReg._2_2_ = 0x144;
      }
      break;
    default:
switchD_016313d5_caseD_6:
      WasmTypes::
      CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                ();
      pWVar13 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (pWVar13,L"Unknown argument type %u",(ulong)_funcReg >> 0x20);
      __cxa_throw(pWVar13,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    case Any:
      bVar5 = IsUnreachable(this);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x4a6,"(IsUnreachable())","IsUnreachable()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      bVar5 = IsUnreachable(this);
      if (!bVar5) goto switchD_016313d5_caseD_6;
      slotReg._2_2_ = 0x14;
    }
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)slotReg._2_2_,(ulong)local_b0,(ulong)_funcReg & 0xffffffff);
    if (bVar17) {
      local_b0 = local_b0 + 1;
    }
    else {
      slotReg._0_2_ = WasmSignature::GetParamSize(stack0xffffffffffffffd0,info_1.type._2_2_);
      bVar5 = Math::IsAligned<unsigned_short>((ArgSlot)slotReg,8);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x4bc,"(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)))",
                           "Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var))");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      local_b0 = local_b0 + ((ArgSlot)slotReg >> 3);
    }
    info_1.type._2_2_ = info_1.type._2_2_ + 1;
  } while( true );
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitCall()
{
    uint32 funcNum = Js::Constants::UninitializedValue;
    uint32 signatureId = Js::Constants::UninitializedValue;
    WasmSignature* calleeSignature = nullptr;
    Js::ProfileId profileId = Js::Constants::NoProfileId;
    EmitInfo indirectIndexInfo;
    const bool isImportCall = GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Import;
    Assert(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk);
    switch (wasmOp)
    {
    case wbCall:
    {
        funcNum = GetReader()->m_currentNode.call.num;
        WasmFunctionInfo* calleeInfo = m_module->GetWasmFunctionInfo(funcNum);
        calleeSignature = calleeInfo->GetSignature();
        // currently only handle inlining internal function calls
        // in future we can expand to all calls by adding checks in inliner and falling back to call in case ScriptFunction doesn't match
        if (GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function && !PHASE_TRACE1(Js::WasmInOutPhase))
        {
            profileId = GetNextProfileId();
        }
        break;
    }
    case wbCallIndirect:
        indirectIndexInfo = PopEvalStack(WasmTypes::I32, _u("Indirect call index must be int type"));
        signatureId = GetReader()->m_currentNode.call.num;
        calleeSignature = m_module->GetSignature(signatureId);
        break;
    default:
        Assume(UNREACHED);
    }

    const auto argOverflow = []
    {
        throw WasmCompilationException(_u("Argument size too big"));
    };

    // emit start call
    Js::ArgSlot argSize;
    Js::OpCodeAsmJs startCallOp;
    if (isImportCall)
    {
        argSize = ArgSlotMath::Mul(calleeSignature->GetParamCount(), sizeof(Js::Var), argOverflow);
        startCallOp = Js::OpCodeAsmJs::StartCall;
    }
    else
    {
        startCallOp = Js::OpCodeAsmJs::I_StartCall;
        argSize = calleeSignature->GetParamsSize();
    }
    // Add return value
    argSize = ArgSlotMath::Add(argSize, sizeof(Js::Var), argOverflow);
    if (!Math::IsAligned<Js::ArgSlot>(argSize, sizeof(Js::Var)))
    {
        AssertMsg(UNREACHED, "Wasm argument size should always be Var aligned");
        throw WasmCompilationException(_u("Internal Error"));
    }

    m_writer->AsmStartCall(startCallOp, argSize);

    Js::ArgSlot nArgs = calleeSignature->GetParamCount();

    // copy args into a list so they could be generated in the right order (FIFO)
    EmitInfo* argsList = AnewArray(&m_alloc, EmitInfo, nArgs);
    for (int i = int(nArgs) - 1; i >= 0; --i)
    {
        EmitInfo info = PopEvalStack(calleeSignature->GetParam((Js::ArgSlot)i), _u("Call argument does not match formal type"));
        // We can release the location of the arguments now, because we won't create new temps between start/call
        argsList[i] = info;
    }

    // Skip the this pointer (aka undefined)
    uint32 argLoc = 1;
    for (Js::ArgSlot i = 0; i < nArgs; ++i)
    {
        EmitInfo info = argsList[i];

        Js::OpCodeAsmJs argOp = Js::OpCodeAsmJs::Nop;
        switch (info.type)
        {
        case WasmTypes::F32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Flt : Js::OpCodeAsmJs::I_ArgOut_Flt;
            break;
        case WasmTypes::F64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Db : Js::OpCodeAsmJs::I_ArgOut_Db;
            break;
        case WasmTypes::I32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Int : Js::OpCodeAsmJs::I_ArgOut_Int;
            break;
        case WasmTypes::I64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Long : Js::OpCodeAsmJs::I_ArgOut_Long;
            break;
#ifdef ENABLE_WASM_SIMD
        case WasmTypes::V128:
            Simd::EnsureSimdIsEnabled();
            argOp = isImportCall ? Js::OpCodeAsmJs::Simd128_ArgOut_F4 : Js::OpCodeAsmJs::Simd128_I_ArgOut_F4;
            break;
#endif
        case WasmTypes::Any:
            // In unreachable mode allow any type as argument since we won't actually emit the call
            Assert(IsUnreachable());
            if (IsUnreachable())
            {
                argOp = Js::OpCodeAsmJs::ArgOut_Int;
                break;
            }
            // Fall through
        default:
            WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
            throw WasmCompilationException(_u("Unknown argument type %u"), info.type);
        }

        m_writer->AsmReg2(argOp, argLoc, info.location);

        // Calculated next argument Js::Var location
        if (isImportCall)
        {
            ++argLoc;
        }
        else
        {
            const Js::ArgSlot currentArgSize = calleeSignature->GetParamSize(i);
            Assert(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)));
            argLoc += currentArgSize / sizeof(Js::Var);
        }
    }

    Js::RegSlot funcReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();

    // emit call
    switch (wasmOp)
    {
    case wbCall:
    {
        uint32 offset = isImportCall ? m_module->GetImportFuncOffset() : m_module->GetFuncOffset();
        uint32 index = UInt32Math::Add(offset, funcNum);
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlot, funcReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, index);
        break;
    }
    case wbCallIndirect:
    {
        Js::RegSlot slotReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlotArr, slotReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, m_module->GetTableEnvironmentOffset());
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdArr_WasmFunc, funcReg, slotReg, indirectIndexInfo.location);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(slotReg);
        m_writer->AsmReg1IntConst1(Js::OpCodeAsmJs::CheckSignature, funcReg, calleeSignature->GetSignatureId());
        break;
    }
    default:
        Assume(UNREACHED);
    }

    // calculate number of RegSlots(Js::Var) the call consumes
    PolymorphicEmitInfo retInfo;
    retInfo.Init(calleeSignature->GetResultCount(), &m_alloc);
    for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
    {
        retInfo.SetInfo(EmitInfo(calleeSignature->GetResult(i)), i);
    }
    Js::ArgSlot args;
    if (isImportCall)
    {
        args = calleeSignature->GetParamCount();
        ArgSlotMath::Inc(args, argOverflow);

        Js::RegSlot varRetReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        AssertOrFailFastMsg(calleeSignature->GetResultCount() <= 1, "Multiple results from function imports not supported");
        WasmTypes::WasmType singleResType = calleeSignature->GetResultCount() > 0 ? calleeSignature->GetResult(0) : WasmTypes::Void;
        m_writer->AsmCall(Js::OpCodeAsmJs::Call, varRetReg, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResType), profileId);

        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(varRetReg);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);

        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        // emit result coercion
        if (calleeSignature->GetResultCount() > 0)
        {
            Js::OpCodeAsmJs convertOp = Js::OpCodeAsmJs::Nop;
            switch (singleResType)
            {
            case WasmTypes::F32:
                convertOp = Js::OpCodeAsmJs::Conv_VTF;
                break;
            case WasmTypes::F64:
                convertOp = Js::OpCodeAsmJs::Conv_VTD;
                break;
            case WasmTypes::I32:
                convertOp = Js::OpCodeAsmJs::Conv_VTI;
                break;
            case WasmTypes::I64:
                convertOp = Js::OpCodeAsmJs::Conv_VTL;
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
                throw WasmCompilationException(_u("Return type: v128 not supported in import calls"));
#endif
            default:
                WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
                throw WasmCompilationException(_u("Unknown call return type %u"), singleResType);
            }
            Js::RegSlot location = GetRegisterSpace(singleResType)->AcquireTmpRegister();
            retInfo.SetInfo(EmitInfo(location, singleResType), 0);
            m_writer->AsmReg2(convertOp, location, varRetReg);
        }
    }
    else
    {
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);
        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
        {
            EmitInfo info(calleeSignature->GetResult(i));
            info.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
            retInfo.SetInfo(info, i);
        }

        EmitInfo singleResultInfo = retInfo.Count() > 0 ? retInfo.GetInfo(0) : EmitInfo(WasmTypes::Void);
        args = (Js::ArgSlot)(::ceil((double)(argSize / sizeof(Js::Var))));
        // todo:: add bytecode to call and set aside multi results
        m_writer->AsmCall(Js::OpCodeAsmJs::I_Call, singleResultInfo.location, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResultInfo.type), profileId);
    }
    AdeleteArray(&m_alloc, nArgs, argsList);

    // WebAssemblyArrayBuffer is not detachable, no need to check for detached state here

    // track stack requirements for out params

    // + 1 for return address
    uint32 maxDepthForLevel = args + 1;
    if (maxDepthForLevel > m_maxArgOutDepth)
    {
        m_maxArgOutDepth = maxDepthForLevel;
    }

    return retInfo;
}